

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

int __thiscall
crnlib::adaptive_huffman_data_model::init(adaptive_huffman_data_model *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint uVar2;
  int extraout_EAX;
  decoder_tables *pdVar3;
  uint in_EDX;
  uint total_syms_local;
  bool encoding_local;
  adaptive_huffman_data_model *this_local;
  
  clear(this);
  this->m_encoding = (bool)((byte)ctx & 1);
  vector<unsigned_short>::resize(&this->m_sym_freq,in_EDX,false);
  vector<unsigned_char>::resize(&this->m_code_sizes,in_EDX,false);
  this->m_total_syms = in_EDX;
  if (this->m_total_syms < 0x11) {
    this->m_decoder_table_bits = '\0';
  }
  else {
    uVar1 = math::ceil_log2i(this->m_total_syms);
    uVar2 = math::minimum<unsigned_int>(uVar1 + 1,0xb);
    this->m_decoder_table_bits = (uint8)uVar2;
  }
  if ((this->m_encoding & 1U) == 0) {
    pdVar3 = crnlib_new<crnlib::prefix_coding::decoder_tables>();
    this->m_pDecode_tables = pdVar3;
  }
  else {
    vector<unsigned_short>::resize(&this->m_codes,in_EDX,false);
  }
  reset(this);
  return extraout_EAX;
}

Assistant:

void adaptive_huffman_data_model::init(bool encoding, uint total_syms)
    {
        clear();

        m_encoding = encoding;

        m_sym_freq.resize(total_syms);
        m_code_sizes.resize(total_syms);

        m_total_syms = total_syms;

        if (m_total_syms <= 16)
        {
            m_decoder_table_bits = 0;
        }
        else
        {
            m_decoder_table_bits = static_cast<uint8>(math::minimum(1 + math::ceil_log2i(m_total_syms), prefix_coding::cMaxTableBits));
        }

        if (m_encoding)
        {
            m_codes.resize(total_syms);
        }
        else
        {
            m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>();
        }

        reset();
    }